

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::WriteUnbuffered
          (PosixWritableFile *this,char *data,size_t size)

{
  long lVar1;
  ssize_t sVar2;
  int *piVar3;
  size_t in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    while( true ) {
      if (in_RCX == 0) {
        (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return (Status)(char *)this;
        }
        goto LAB_00a5b866;
      }
      sVar2 = ::write(*(int *)(data + 0x10010),(void *)size,in_RCX);
      if (sVar2 < 0) break;
      size = size + sVar2;
      in_RCX = in_RCX - sVar2;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    PosixError((anon_unknown_1 *)this,(string *)(data + 0x10018),*piVar3);
    return (Status)(char *)this;
  }
LAB_00a5b866:
  __stack_chk_fail();
}

Assistant:

Status WriteUnbuffered(const char* data, size_t size) {
    while (size > 0) {
      ssize_t write_result = ::write(fd_, data, size);
      if (write_result < 0) {
        if (errno == EINTR) {
          continue;  // Retry
        }
        return PosixError(filename_, errno);
      }
      data += write_result;
      size -= write_result;
    }
    return Status::OK();
  }